

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O0

void __thiscall Imf_3_2::Image::insertChannel(Image *this,string *name,Channel *channel)

{
  bool in_stack_0000004b;
  int in_stack_0000004c;
  int in_stack_00000050;
  PixelType in_stack_00000054;
  string *in_stack_00000058;
  Image *in_stack_00000060;
  
  insertChannel(in_stack_00000060,in_stack_00000058,in_stack_00000054,in_stack_00000050,
                in_stack_0000004c,in_stack_0000004b);
  return;
}

Assistant:

void
Image::insertChannel (const string& name, const Channel& channel)
{
    insertChannel (
        name,
        channel.type,
        channel.xSampling,
        channel.ySampling,
        channel.pLinear);
}